

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O1

void __thiscall sorted_ptr_arr<double>::sort(sorted_ptr_arr<double> *this)

{
  ulong uVar1;
  ulong uVar2;
  TLeonardoHeap<smoothsort_ptr<double>_> lh;
  TLeonardoHeap<smoothsort_ptr<double>_> TStack_28;
  
  if (this->ptr_arr == (smoothsort_ptr<double> *)0x0) {
    __assert_fail("ptr_arr != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gregreen[P]smoothsort/smoothsort.h"
                  ,0x159,"void sorted_ptr_arr<double>::sort() [T = double]");
  }
  TLeonardoHeap<smoothsort_ptr<double>_>::TLeonardoHeap(&TStack_28,this->ptr_arr,this->N);
  uVar1 = this->N - 1;
  if (1 < uVar1) {
    uVar2 = 1;
    do {
      if (TStack_28.first_tree < 2) {
        TStack_28.tree_vector = TStack_28.tree_vector >> 1;
        if (TStack_28.first_tree == 0) {
          TStack_28.first_tree = 1;
        }
        else {
          for (; (TStack_28.first_tree = TStack_28.first_tree + 1,
                 (ulong)TStack_28.first_tree < TStack_28.N + 1 && ((TStack_28.tree_vector & 1) == 0)
                 ); TStack_28.tree_vector = TStack_28.tree_vector >> 1) {
          }
        }
      }
      else {
        TStack_28.first_tree = TStack_28.first_tree - 2;
        TStack_28.tree_vector = (TStack_28.tree_vector << 2 ^ 6) + 1;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != uVar1);
  }
  return;
}

Assistant:

void sort() {
		assert(ptr_arr != NULL);	// Something's gone wrong if the program tries to sort without initializing the data
		TLeonardoHeap< smoothsort_ptr<T> > lh(ptr_arr, N);
		for(size_t i=1; i<N-1; i++) { lh.dequeue_max(N-i); }
	}